

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::TextureCubeArrayFormatCase::iterate(TextureCubeArrayFormatCase *this)

{
  TestContext *this_00;
  bool bVar1;
  IterateResult IVar2;
  int iVar3;
  
  IVar2 = STOP;
  if (((this->super_TestCase).super_TestNode.m_testCtx)->m_testResult !=
      QP_TEST_RESULT_NOT_SUPPORTED) {
    bVar1 = testLayerFace(this,this->m_curLayerFace);
    if ((!bVar1) &&
       (this_00 = (this->super_TestCase).super_TestNode.m_testCtx,
       this_00->m_testResult == QP_TEST_RESULT_PASS)) {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,"Image comparison failed");
    }
    iVar3 = this->m_curLayerFace + 1;
    this->m_curLayerFace = iVar3;
    IVar2 = (IterateResult)(iVar3 < (this->m_texture->m_refTexture).m_depth);
  }
  return IVar2;
}

Assistant:

TextureCubeArrayFormatCase::IterateResult TextureCubeArrayFormatCase::iterate (void)
{
	if (m_testCtx.getTestResult() == QP_TEST_RESULT_NOT_SUPPORTED)
		return STOP;

	// Execute test for all layers.
	bool isOk = testLayerFace(m_curLayerFace);

	if (!isOk && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_curLayerFace += 1;

	return m_curLayerFace < m_texture->getRefTexture().getDepth() ? CONTINUE : STOP;
}